

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UChar32 icu_63::anon_unknown_16::codePointFromValidUTF8(uint8_t *cpStart,uint8_t *cpLimit)

{
  uint uVar1;
  uint uVar2;
  
  if ((uint8_t *)0x3 < cpLimit + ~(ulong)cpStart) {
    return -1;
  }
  uVar1 = (uint)*cpStart;
  switch(cpLimit + ~(ulong)cpStart) {
  case (uint8_t *)0x0:
    goto switchD_0028647f_caseD_0;
  case (uint8_t *)0x1:
    return (*cpStart & 0x1f) << 6 | cpStart[1] & 0x3f;
  case (uint8_t *)0x2:
    uVar2 = cpStart[2] & 0x3f;
    uVar1 = (uVar1 & 0xf) << 0xc | (cpStart[1] & 0x3f) << 6;
    break;
  case (uint8_t *)0x3:
    uVar2 = (cpStart[2] & 0x3f) << 6 | (cpStart[1] & 0x3f) << 0xc | (uVar1 & 7) << 0x12;
    uVar1 = cpStart[3] & 0x3f;
  }
  uVar1 = uVar1 | uVar2;
switchD_0028647f_caseD_0:
  return uVar1;
}

Assistant:

UChar32 codePointFromValidUTF8(const uint8_t *cpStart, const uint8_t *cpLimit) {
    // Similar to U8_NEXT_UNSAFE(s, i, c).
    U_ASSERT(cpStart < cpLimit);
    uint8_t c = *cpStart;
    switch(cpLimit-cpStart) {
    case 1:
        return c;
    case 2:
        return ((c&0x1f)<<6) | (cpStart[1]&0x3f);
    case 3:
        // no need for (c&0xf) because the upper bits are truncated after <<12 in the cast to (UChar)
        return (UChar)((c<<12) | ((cpStart[1]&0x3f)<<6) | (cpStart[2]&0x3f));
    case 4:
        return ((c&7)<<18) | ((cpStart[1]&0x3f)<<12) | ((cpStart[2]&0x3f)<<6) | (cpStart[3]&0x3f);
    default:
        U_ASSERT(FALSE);  // Should not occur.
        return U_SENTINEL;
    }
}